

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path,_Bool secure)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  CURLofft CVar7;
  time_t tVar8;
  Cookie *co;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  time_t tVar12;
  size_t sVar13;
  Cookie *pCVar14;
  char *pcVar15;
  size_t max;
  byte bVar16;
  long lVar17;
  curl_off_t *num;
  Cookie *pCVar18;
  Cookie *pCVar19;
  uint uVar20;
  char *pcVar21;
  bool bVar22;
  byte bVar23;
  char *local_2068;
  char name [4096];
  char what [4096];
  
  bVar23 = 0;
  tVar8 = time((time_t *)0x0);
  co = (Cookie *)(*Curl_ccalloc)(1,0x68);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar9 = strlen(lineptr);
    if (5000 < sVar9) {
LAB_0010dcc9:
      (*Curl_cfree)(co);
      return (Cookie *)0x0;
    }
    pcVar10 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_2068 = domain;
    bVar22 = false;
LAB_0010dcf5:
    what[0] = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar6 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
    if (iVar6 < 1) goto LAB_0010dee1;
    sVar9 = strlen(what);
    sVar11 = strlen(name);
    if (((0xffe < sVar11) || (0xffe < sVar9)) || (0x1000 < sVar9 + sVar11)) {
      freecookie(co);
      Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",sVar11,sVar9);
      return (Cookie *)0x0;
    }
    cVar1 = lineptr[sVar11];
    if (sVar11 == 0) {
      sVar11 = 0;
    }
    else {
      cVar3 = lineptr[sVar11 - 1];
      if ((cVar3 == ' ') || (cVar3 == '\t')) {
LAB_0010dd7f:
        if (cVar3 != ' ') {
          if (((cVar3 == '\0') || (cVar3 != '\t')) || (sVar11 == 0)) goto LAB_0010ddaa;
LAB_0010dd9a:
          cVar3 = lineptr[sVar11 - 2];
          sVar11 = sVar11 - 1;
          goto LAB_0010dd7f;
        }
        if (sVar11 != 0) goto LAB_0010dd9a;
        sVar11 = 0;
LAB_0010ddaa:
        name[sVar11] = '\0';
      }
    }
    while ((sVar9 != 0 && ((name[sVar9 + 0xfff] == ' ' || (name[sVar9 + 0xfff] == '\t'))))) {
      name[sVar9 + 0xfff] = '\0';
      sVar9 = sVar9 - 1;
    }
    for (pcVar21 = what; (*pcVar21 == ' ' || (*pcVar21 == '\t')); pcVar21 = pcVar21 + 1) {
    }
    if (((3 < sVar11) && (name[0] == '_')) && (name[1] == '_')) {
      iVar6 = Curl_strncasecompare("__Secure-",name,9);
      bVar16 = 1;
      if (iVar6 == 0) {
        iVar6 = Curl_strncasecompare("__Host-",name,7);
        bVar16 = 2;
        if (iVar6 == 0) goto LAB_0010de3c;
      }
      co->prefix = co->prefix | bVar16;
    }
LAB_0010de3c:
    if (co->name == (char *)0x0) {
      bVar2 = true;
      if (cVar1 != '=') goto LAB_0010e447;
      pcVar15 = (*Curl_cstrdup)(name);
      co->name = pcVar15;
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->value = pcVar21;
      if (co->name == (char *)0x0) goto LAB_0010e447;
LAB_0010ded8:
      bVar2 = true;
      if (pcVar21 == (char *)0x0) goto LAB_0010e447;
LAB_0010dee1:
      bVar2 = bVar22;
      if ((pcVar10 == (char *)0x0) || (lineptr = pcVar10, *pcVar10 == '\0')) goto LAB_0010e447;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar10 = strchr(lineptr,0x3b);
      bVar22 = bVar2;
      if (pcVar10 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_0010e447;
        sVar9 = strlen(lineptr);
        pcVar10 = lineptr + sVar9;
      }
      goto LAB_0010dcf5;
    }
    if (sVar9 == 0) {
      iVar6 = Curl_strcasecompare("secure",name);
      if (iVar6 == 0) {
        iVar6 = Curl_strcasecompare("httponly",name);
        if (iVar6 == 0) {
          if (cVar1 == '=') goto LAB_0010de53;
        }
        else {
          co->httponly = true;
        }
      }
      else {
        if ((!secure) && (c->running != false)) goto LAB_0010e4ed;
        co->secure = true;
      }
      goto LAB_0010dee1;
    }
LAB_0010de53:
    iVar6 = Curl_strcasecompare("path",name);
    if (iVar6 != 0) {
      (*Curl_cfree)(co->path);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->path = pcVar21;
      bVar2 = true;
      if (pcVar21 != (char *)0x0) {
        (*Curl_cfree)(co->spath);
        pcVar21 = sanitize_cookie_path(co->path);
        co->spath = pcVar21;
        goto LAB_0010ded8;
      }
      goto LAB_0010e447;
    }
    iVar6 = Curl_strcasecompare("domain",name);
    if (iVar6 == 0) {
      iVar6 = Curl_strcasecompare("version",name);
      if (iVar6 == 0) {
        iVar6 = Curl_strcasecompare("max-age",name);
        if (iVar6 != 0) {
          (*Curl_cfree)(co->maxage);
          pcVar21 = (*Curl_cstrdup)(pcVar21);
          co->maxage = pcVar21;
          if (pcVar21 != (char *)0x0) goto LAB_0010dee1;
          bVar2 = true;
          goto LAB_0010e505;
        }
        iVar6 = Curl_strcasecompare("expires",name);
        if (iVar6 != 0) {
          (*Curl_cfree)(co->expirestr);
          pcVar21 = (*Curl_cstrdup)(pcVar21);
          co->expirestr = pcVar21;
          goto LAB_0010e0d3;
        }
        goto LAB_0010dee1;
      }
      (*Curl_cfree)(co->version);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->version = pcVar21;
    }
    else {
      pcVar21 = pcVar21 + (*pcVar21 == '.');
      pcVar15 = strchr(pcVar21,0x2e);
      if ((pcVar15 == (char *)0x0) && (iVar6 = Curl_strcasecompare(pcVar21,"localhost"), iVar6 == 0)
         ) {
        local_2068 = ":";
      }
      pcVar15 = local_2068;
      if (local_2068 == (char *)0x0) {
        pcVar15 = pcVar21;
      }
      _Var4 = isip(pcVar15);
      if (local_2068 != (char *)0x0) {
        if (_Var4) {
          iVar6 = strcmp(pcVar21,local_2068);
          if (iVar6 != 0) {
LAB_0010e06a:
            Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar21);
            bVar22 = true;
            goto LAB_0010dee1;
          }
        }
        else {
          _Var5 = tailmatch(pcVar21,local_2068);
          if (!_Var5) goto LAB_0010e06a;
        }
      }
      (*Curl_cfree)(co->domain);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->domain = pcVar21;
      if (pcVar21 != (char *)0x0 && !_Var4) {
        co->tailmatch = true;
        goto LAB_0010dee1;
      }
    }
LAB_0010e0d3:
    if (pcVar21 != (char *)0x0) goto LAB_0010dee1;
LAB_0010e4ed:
    bVar2 = true;
LAB_0010e447:
    pcVar10 = co->maxage;
    if (pcVar10 == (char *)0x0) {
LAB_0010e505:
      if (co->expirestr != (char *)0x0) {
        tVar12 = curl_getdate(co->expirestr,(time_t *)0x0);
        co->expires = tVar12;
        if (tVar12 == 0) {
          co->expires = 1;
        }
        else if (tVar12 < 0) {
          co->expires = 0;
        }
      }
    }
    else {
      num = &co->expires;
      CVar7 = curlx_strtoofft(pcVar10 + (*pcVar10 == '\"'),(char **)0x0,10,num);
      if (CVar7 == CURL_OFFT_OK) {
        lVar17 = *num;
        if (lVar17 == 0) {
          *num = 1;
        }
        else {
          if (0x7fffffffffffffff - tVar8 < lVar17) goto LAB_0010e4b1;
          *num = lVar17 + tVar8;
        }
      }
      else if (CVar7 == CURL_OFFT_FLOW) {
LAB_0010e4b1:
        *num = 0x7fffffffffffffff;
      }
    }
    bVar22 = bVar2;
    if (((!bVar2) && (co->domain == (char *)0x0)) && (local_2068 != (char *)0x0)) {
      pcVar10 = (*Curl_cstrdup)(local_2068);
      co->domain = pcVar10;
      bVar22 = true;
      if (pcVar10 != (char *)0x0) {
        bVar22 = bVar2;
      }
    }
    if (((!bVar22) && (path != (char *)0x0)) && (co->path == (char *)0x0)) {
      pcVar10 = strchr(path,0x3f);
      if (pcVar10 == (char *)0x0) {
        pcVar10 = strrchr(path,0x2f);
      }
      else {
        pcVar10 = (char *)Curl_memrchr(path,0x2f,(long)pcVar10 - (long)path);
      }
      if (pcVar10 != (char *)0x0) {
        pcVar21 = (char *)(*Curl_cmalloc)((size_t)(pcVar10 + (2 - (long)path)));
        co->path = pcVar21;
        if (pcVar21 == (char *)0x0) goto LAB_0010e8dd;
        memcpy(pcVar21,path,(size_t)(pcVar10 + (1 - (long)path)));
        co->path[(long)(pcVar10 + (1 - (long)path))] = '\0';
        pcVar10 = sanitize_cookie_path(co->path);
        co->spath = pcVar10;
        bVar22 = pcVar10 == (char *)0x0;
      }
    }
    if ((bVar22) || (co->name == (char *)0x0)) goto LAB_0010e8dd;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar6 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar6 == 0) {
      lineptr = lineptr + 10;
      co->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0010dcc9;
    pcVar10 = strchr(lineptr,0xd);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    pcVar10 = strchr(lineptr,10);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    pcVar10 = strtok_r(lineptr,"\t",(char **)name);
    bVar22 = false;
    uVar20 = 0;
    while ((pcVar10 != (char *)0x0 && (!bVar22))) {
      switch(uVar20) {
      case 0:
        pcVar10 = (*Curl_cstrdup)(pcVar10 + (*pcVar10 == '.'));
        co->domain = pcVar10;
        if (pcVar10 == (char *)0x0) {
          bVar22 = true;
        }
        uVar20 = 0;
        break;
      case 1:
        iVar6 = Curl_strcasecompare(pcVar10,"TRUE");
        co->tailmatch = iVar6 != 0;
        uVar20 = 1;
        break;
      case 2:
        iVar6 = strcmp("TRUE",pcVar10);
        if ((iVar6 == 0) || (iVar6 = strcmp("FALSE",pcVar10), iVar6 == 0)) {
          pcVar21 = (*Curl_cstrdup)("/");
          co->path = pcVar21;
          pcVar15 = (*Curl_cstrdup)("/");
          if (pcVar21 == (char *)0x0) {
            bVar22 = true;
          }
          co->spath = pcVar15;
          bVar2 = bVar22;
          if (pcVar15 == (char *)0x0) {
            bVar2 = true;
          }
          goto LAB_0010e363;
        }
        pcVar10 = (*Curl_cstrdup)(pcVar10);
        co->path = pcVar10;
        if (pcVar10 == (char *)0x0) {
          bVar22 = true;
        }
        else {
          pcVar10 = sanitize_cookie_path(pcVar10);
          co->spath = pcVar10;
          if (pcVar10 == (char *)0x0) {
            bVar22 = true;
          }
        }
        uVar20 = 2;
        break;
      case 3:
        bVar2 = bVar22;
LAB_0010e363:
        co->secure = false;
        iVar6 = Curl_strcasecompare(pcVar10,"TRUE");
        if (iVar6 != 0) {
          if (!secure) {
            uVar20 = 3;
            bVar22 = true;
            if (c->running != true) break;
          }
          co->secure = true;
        }
        uVar20 = 3;
        bVar22 = bVar2;
        break;
      case 4:
        CVar7 = curlx_strtoofft(pcVar10,(char **)0x0,10,&co->expires);
        if (CVar7 != CURL_OFFT_OK) {
          bVar22 = true;
        }
        uVar20 = 4;
        break;
      case 5:
        pcVar10 = (*Curl_cstrdup)(pcVar10);
        co->name = pcVar10;
        if (pcVar10 == (char *)0x0) {
          bVar22 = true;
        }
        else {
          iVar6 = Curl_strncasecompare("__Secure-",pcVar10,9);
          if (iVar6 == 0) {
            iVar6 = Curl_strncasecompare("__Host-",co->name,7);
            if (iVar6 != 0) {
              co->prefix = co->prefix | 2;
            }
          }
          else {
            co->prefix = co->prefix | 1;
          }
        }
        uVar20 = 5;
        break;
      case 6:
        pcVar10 = (*Curl_cstrdup)(pcVar10);
        co->value = pcVar10;
        if (pcVar10 == (char *)0x0) {
          bVar22 = true;
        }
        uVar20 = 6;
      }
      pcVar10 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar20 = uVar20 + 1;
    }
    if (uVar20 == 6) {
      pcVar10 = (*Curl_cstrdup)("");
      co->value = pcVar10;
      if (pcVar10 == (char *)0x0) {
        bVar22 = true;
      }
      uVar20 = pcVar10 == (char *)0x0 ^ 7;
    }
    if ((bVar22) || (uVar20 != 7)) goto LAB_0010e8dd;
  }
  if (((((co->prefix & 1) == 0) || (co->secure != false)) &&
      (((co->prefix & 2) == 0 ||
       ((((co->secure == true && (pcVar10 = co->path, pcVar10 != (char *)0x0)) && (*pcVar10 == '/'))
        && ((pcVar10[1] == '\0' && (co->tailmatch != true)))))))) &&
     ((c->running != false || ((c->newsession != true || (co->expires != 0)))))) {
    co->livecookie = c->running;
    iVar6 = c->lastct + 1;
    c->lastct = iVar6;
    co->creationtime = iVar6;
    if (!noexpire) {
      remove_expired(c);
    }
    sVar13 = cookiehash(co->domain);
    pCVar14 = (Cookie *)(c->cookies + sVar13);
    pCVar18 = (Cookie *)0x0;
    bVar22 = false;
LAB_0010e605:
    do {
      do {
        do {
          bVar2 = bVar22;
          pCVar14 = pCVar14->next;
          if (pCVar14 == (Cookie *)0x0) goto LAB_0010e7d3;
          iVar6 = Curl_strcasecompare(pCVar14->name,co->name);
          pCVar18 = pCVar14;
          bVar22 = bVar2;
        } while (iVar6 == 0);
        pcVar10 = co->domain;
        if (pCVar14->domain == (char *)0x0) {
          bVar22 = pcVar10 == (char *)0x0;
LAB_0010e653:
          if (bVar22) {
            bVar2 = true;
          }
        }
        else if ((pcVar10 != (char *)0x0) &&
                (iVar6 = Curl_strcasecompare(pCVar14->domain,pcVar10), iVar6 != 0)) {
          bVar22 = pCVar14->tailmatch == co->tailmatch;
          goto LAB_0010e653;
        }
        bVar22 = bVar2;
      } while (!bVar2);
      pcVar10 = pCVar14->spath;
      pcVar21 = co->spath;
      if (pcVar10 != (char *)0x0) {
        bVar22 = false;
        if (pcVar21 != (char *)0x0) {
          if ((pCVar14->secure == true) && (co->secure == false && !secure)) {
            pcVar15 = strchr(pcVar10 + 1,0x2f);
            if (pcVar15 == (char *)0x0) {
              max = strlen(pcVar10);
            }
            else {
              max = (long)pcVar15 - (long)pcVar10;
            }
            iVar6 = Curl_strncasecompare(pcVar10,pcVar21,max);
            if (iVar6 != 0) goto LAB_0010e8dd;
            goto LAB_0010e6c8;
          }
          iVar6 = Curl_strcasecompare(pcVar10,pcVar21);
          bVar22 = false;
          if (iVar6 != 0) break;
        }
        goto LAB_0010e605;
      }
      bVar22 = false;
    } while (pcVar21 != (char *)0x0);
    bVar2 = true;
LAB_0010e6c8:
    if ((co->livecookie != false) || (pCVar14->livecookie != true)) {
      co->next = pCVar14->next;
      co->creationtime = pCVar14->creationtime;
      (*Curl_cfree)(pCVar14->name);
      (*Curl_cfree)(pCVar14->value);
      (*Curl_cfree)(pCVar14->domain);
      (*Curl_cfree)(pCVar14->path);
      (*Curl_cfree)(pCVar14->spath);
      (*Curl_cfree)(pCVar14->expirestr);
      (*Curl_cfree)(pCVar14->version);
      (*Curl_cfree)(pCVar14->maxage);
      pCVar18 = co;
      pCVar19 = pCVar14;
      for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
        pCVar19->next = pCVar18->next;
        pCVar18 = (Cookie *)((long)pCVar18 + (ulong)bVar23 * -0x10 + 8);
        pCVar19 = (Cookie *)((long)pCVar19 + (ulong)bVar23 * -0x10 + 8);
      }
      (*Curl_cfree)(co);
      pCVar19 = pCVar14;
      do {
        pCVar18 = pCVar19;
        pCVar19 = pCVar18->next;
        co = pCVar14;
      } while (pCVar18->next != (Cookie *)0x0);
LAB_0010e7d3:
      if (c->running != false) {
        pcVar10 = "Added";
        if (bVar2) {
          pcVar10 = "Replaced";
        }
        Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar10,co->name,
                   co->value,co->domain,co->path,co->expires);
      }
      if (!bVar2) {
        pCVar14 = (Cookie *)(c->cookies + sVar13);
        if (pCVar18 != (Cookie *)0x0) {
          pCVar14 = pCVar18;
        }
        pCVar14->next = co;
        c->numcookies = c->numcookies + 1;
        return co;
      }
      return co;
    }
  }
LAB_0010e8dd:
  freecookie(co);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        /*
         * Check if we have a reserved prefix set before anything else, as we
         * otherwise have to test for the prefix in both the cookie name and
         * "the rest". Prefixes must start with '__' and end with a '-', so
         * only test for names where that can possibly be true.
         */
        if(nlen > 3 && name[0] == '_' && name[1] == '_') {
          if(strncasecompare("__Secure-", name, 9))
            co->prefix |= COOKIE_PREFIX__SECURE;
          else if(strncasecompare("__Host-", name, 7))
            co->prefix |= COOKIE_PREFIX__HOST;
        }

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          /*
           * secure cookies are only allowed to be set when the connection is
           * using a secure protocol, or when the cookie is being set by
           * reading from file
           */
          if(strcasecompare("secure", name)) {
            if(secure || !c->running) {
              co->secure = TRUE;
            }
            else {
              badcookie = TRUE;
              break;
            }
          }
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(!co->expires)
          /* already expired */
          co->expires = 1;
        else if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = FALSE;
        if(strcasecompare(ptr, "TRUE")) {
          if(secure || c->running)
            co->secure = TRUE;
          else
            badcookie = TRUE;
        }
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        else {
          /* For Netscape file format cookies we check prefix on the name */
          if(strncasecompare("__Secure-", co->name, 9))
            co->prefix |= COOKIE_PREFIX__SECURE;
          else if(strncasecompare("__Host-", co->name, 7))
            co->prefix |= COOKIE_PREFIX__HOST;
        }
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(co->prefix & COOKIE_PREFIX__SECURE) {
    /* The __Secure- prefix only requires that the cookie be set secure */
    if(!co->secure) {
      freecookie(co);
      return NULL;
    }
  }
  if(co->prefix & COOKIE_PREFIX__HOST) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else {
      freecookie(co);
      return NULL;
    }
  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
  if(domain && co->domain && !isip(co->domain)) {
    const psl_ctx_t *psl = Curl_psl_use(data);
    int acceptable;

    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
      acceptable = !bad_domain(domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(clist->secure && !co->secure && !secure) {
            size_t cllen;
            const char *sep;

            /*
             * A non-secure cookie may not overlay an existing secure cookie.
             * For an existing cookie "a" with path "/login", refuse a new
             * cookie "a" with for example path "/login/en", while the path
             * "/loginhelper" is ok.
             */

            sep = strchr(clist->spath + 1, '/');

            if(sep)
              cllen = sep - clist->spath;
            else
              cllen = strlen(clist->spath);

            if(strncasecompare(clist->spath, co->spath, cllen)) {
              freecookie(co);
              return NULL;
            }
          }
          else if(strcasecompare(clist->spath, co->spath))
            replace_old = TRUE;
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}